

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

string * __thiscall
soul::AST::Connection::getEndpointName_abi_cxx11_
          (string *__return_storage_ptr__,Connection *this,Expression *e,bool isSource)

{
  SourceCodeText *pSVar1;
  long lVar2;
  bool isSource_00;
  undefined1 in_R8B;
  Context *pCVar3;
  pool_ptr<soul::AST::EndpointDeclaration> endpoint;
  Context *local_60;
  CompileMessage local_58;
  
  (*(this->super_ASTObject)._vptr_ASTObject[8])(&local_60);
  pCVar3 = local_60;
  if (local_60 != (Context *)0x0) {
    pSVar1 = local_60[2].location.sourceCode.object;
    if (pSVar1 == (SourceCodeText *)0x0) {
      throwInternalCompilerError("isValid()","operator const std::basic_string<char> &",0x21);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)pSVar1,
               (pSVar1->filename)._M_dataplus._M_p + *(long *)pSVar1);
    if (pCVar3 != (Context *)0x0) {
      return __return_storage_ptr__;
    }
  }
  lVar2 = __dynamic_cast(this,&Expression::typeinfo,&ConnectionEndpointRef::typeinfo);
  if (lVar2 != 0) {
    if (*(UnqualifiedName **)(lVar2 + 0x38) == (UnqualifiedName *)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    UnqualifiedName::toString_abi_cxx11_(__return_storage_ptr__,*(UnqualifiedName **)(lVar2 + 0x38))
    ;
    if (lVar2 != 0) {
      return __return_storage_ptr__;
    }
  }
  isSource_00 = false;
  lVar2 = __dynamic_cast(this,&Expression::typeinfo,&ArrayElementRef::typeinfo);
  if (lVar2 != 0) {
    if (*(Connection **)(lVar2 + 0x30) == (Connection *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    getEndpointName_abi_cxx11_
              (__return_storage_ptr__,*(Connection **)(lVar2 + 0x30),(Expression *)((ulong)e & 0xff)
               ,isSource_00);
    if (lVar2 != 0) {
      return __return_storage_ptr__;
    }
  }
  lVar2 = __dynamic_cast(this,&Expression::typeinfo,&DotOperator::typeinfo,0);
  if (lVar2 == 0) {
    (*(this->super_ASTObject)._vptr_ASTObject[6])(&local_60,this);
    pCVar3 = &(this->super_ASTObject).context;
    if (local_60 == (Context *)0x0) {
      CompileMessageHelpers::createMessage<>
                (&local_58,syntax,error,"Expected a processor name or endpoint");
      Context::throwError(pCVar3,&local_58,false);
    }
    getDefaultEndpointName_abi_cxx11_
              (__return_storage_ptr__,(Connection *)pCVar3,local_60,
               (ProcessorBase *)(ulong)(byte)((byte)e ^ 1),(bool)in_R8B);
  }
  else {
    UnqualifiedName::toString_abi_cxx11_(__return_storage_ptr__,*(UnqualifiedName **)(lVar2 + 0x38))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getEndpointName (Expression& e, bool isSource)
        {
            if (auto endpoint = e.getAsEndpoint())           return endpoint->name;
            if (auto er = cast<ConnectionEndpointRef> (e))   return er->endpointName->toString();
            if (auto ar = cast<ArrayElementRef> (e))         return getEndpointName (*ar->object, isSource);
            if (auto dot = cast<DotOperator> (e))            return dot->rhs.toString();
            if (auto p = e.getAsProcessor())                 return getDefaultEndpointName (e.context, *p, ! isSource);

            e.context.throwError (Errors::expectedProcessorOrEndpoint());
        }